

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtable.cpp
# Opt level: O0

void __thiscall YAJLQTable::YAJLQTable(YAJLQTable *this,bitio_stream *bstream)

{
  int iVar1;
  byte bVar2;
  u16 *__nbytes;
  size_t sVar3;
  ssize_t sVar4;
  void *__buf;
  void *__buf_00;
  undefined8 extraout_RDX;
  void *__buf_01;
  int i;
  int *__end1;
  int *__begin1;
  int (*__range1) [64];
  uint8_t qk_size;
  bitio_stream *bstream_local;
  YAJLQTable *this_local;
  
  __nbytes = (u16 *)operator_new__(0x80);
  this->coeffs = __nbytes;
  sVar3 = bitio::bitio_stream::read(bstream,4,__buf,(size_t)__nbytes);
  this->precision = (u8)sVar3;
  sVar4 = bitio::bitio_stream::read(bstream,4,__buf_00,sVar3);
  this->dest_id = (u8)sVar4;
  __buf_01 = (void *)(ulong)this->precision;
  sVar3 = 8;
  bVar2 = 0x10;
  if (this->precision == 0) {
    bVar2 = 8;
  }
  for (__end1 = &scanorders::ZZ; __end1 != (int *)"rb"; __end1 = __end1 + 1) {
    iVar1 = *__end1;
    sVar4 = bitio::bitio_stream::read(bstream,(uint)bVar2,__buf_01,sVar3);
    __buf_01 = (void *)CONCAT62((int6)((ulong)extraout_RDX >> 0x10),(u16)sVar4);
    sVar3 = (size_t)iVar1;
    this->coeffs[sVar3] = (u16)sVar4;
  }
  return;
}

Assistant:

YAJLQTable::YAJLQTable(bitio::bitio_stream *bstream) {
    coeffs = new u16[0x40];
    precision = bstream->read(0x4);
    dest_id = bstream->read(0x4);
    uint8_t qk_size = precision == 0 ? 8 : 16;
    for (int i : scanorders::ZZ) {
        coeffs[i] = bstream->read(qk_size);
    }
}